

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,uint32_t relocType)

{
  size_type *psVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  Value VVar6;
  void *pvVar7;
  CodeHolder *pCVar8;
  Slot *pSVar9;
  bool bVar10;
  uint8_t uVar11;
  Error EVar12;
  uint uVar13;
  RelocEntry *pRVar14;
  ulong uVar15;
  ulong uVar16;
  AddressTableEntry *pAVar17;
  Slot *pSVar18;
  long lVar19;
  uint64_t *out;
  bool bVar20;
  Value VVar21;
  Value VVar22;
  ZoneAllocator *pZVar23;
  CodeHolder *self;
  long lVar24;
  CodeHolder *pCVar25;
  Value VVar26;
  undefined8 unaff_R13;
  ulong uVar27;
  ulong *puVar28;
  Value allocator;
  ulong auStack_110 [2];
  Value VStack_100;
  ulong uStack_f8;
  Slot *pSStack_f0;
  Value VStack_e8;
  Value VStack_e0;
  ulong uStack_d8;
  CodeHolder *pCStack_d0;
  Value VStack_c8;
  code *pcStack_c0;
  CodeHolder *pCStack_b0;
  Error EStack_a4;
  size_t sStack_a0;
  long lStack_98;
  ulong uStack_90;
  CodeHolder *pCStack_88;
  ulong uStack_80;
  Value *pVStack_78;
  RelocEntry **ppRStack_70;
  Value VStack_68;
  size_t local_30;
  
  allocator.expression = (Expression *)&this->_allocator;
  uVar13 = (this->_relocations).super_ZoneVectorBase._size;
  if ((this->_relocations).super_ZoneVectorBase._capacity == uVar13) {
    EVar12 = ZoneVectorBase::_grow
                       (&(this->_relocations).super_ZoneVectorBase,
                        (ZoneAllocator *)allocator.expression,8,1);
    if (EVar12 != 0) {
      return EVar12;
    }
    uVar13 = (this->_relocations).super_ZoneVectorBase._size;
  }
  VVar26.constant._4_4_ = 0;
  VVar26.constant._0_4_ = uVar13;
  if (uVar13 == 0xffffffff) {
    EVar12 = 0x17;
  }
  else {
    if (((ZoneAllocator *)allocator.expression)->_zone == (Zone *)0x0) {
      newRelocEntry();
    }
    else {
      pZVar23 = (ZoneAllocator *)allocator;
      pRVar14 = (RelocEntry *)
                ZoneAllocator::_allocZeroed((ZoneAllocator *)allocator.expression,0x28,&local_30);
      if (pRVar14 != (RelocEntry *)0x0) {
        pRVar14->_id = uVar13;
        pRVar14->_relocType = relocType & 0xff;
        pRVar14->_sourceSectionId = 0xffffffff;
        pRVar14->_targetSectionId = 0xffffffff;
        uVar13 = (this->_relocations).super_ZoneVectorBase._size;
        if (uVar13 < (this->_relocations).super_ZoneVectorBase._capacity) {
          *(RelocEntry **)
           ((long)(this->_relocations).super_ZoneVectorBase._data + (ulong)uVar13 * 8) = pRVar14;
          psVar1 = &(this->_relocations).super_ZoneVectorBase._size;
          *psVar1 = *psVar1 + 1;
          *dst = pRVar14;
          return 0;
        }
        newRelocEntry();
        if ((ulong)*(uint32_t *)((long)(pZVar23 + 2) + 8) == 0) {
          uVar13 = 0;
        }
        else {
          lVar19 = 0;
          self = (CodeHolder *)0x0;
          VVar21.constant = 0;
          do {
            lVar24 = *(long *)(*(long *)(pZVar23 + 2) + lVar19);
            uVar16 = *(ulong *)(lVar24 + 0x50);
            if (*(ulong *)(lVar24 + 0x50) < *(ulong *)(lVar24 + 0x18)) {
              uVar16 = *(ulong *)(lVar24 + 0x18);
            }
            if (uVar16 != 0) {
              pCVar25 = (CodeHolder *)
                        (-(ulong)*(uint *)(lVar24 + 8) &
                        (long)(self->_allocator)._slots + ((ulong)*(uint *)(lVar24 + 8) - 0x49));
              if (pCVar25 < self) {
                codeSize();
                if ((CodeBuffer *)VVar21.constant == (CodeBuffer *)0xffffffffffffffff) {
                  return 2;
                }
                self->_baseAddress = (uint64_t)VVar21;
                bVar2 = (self->_environment)._arch;
                uVar27 = CONCAT71((int7)((ulong)unaff_R13 >> 8),bVar2);
                VVar6 = (Value)self->_addressTableSection;
                uVar16 = 0;
                VVar22 = VVar21;
                pCVar25 = self;
                ppRStack_70 = dst;
                VStack_68 = VVar26;
                if ((Section *)VVar6.constant == (Section *)0x0) {
                  lStack_98 = 0;
                }
                else {
                  VVar26.expression = (Expression *)(VVar6.constant + 0x48);
                  if (*(RelocEntry **)(VVar6.constant + 0x58) < (RelocEntry *)(VVar6.label)->_offset
                     ) {
                    if ((*(byte *)(VVar6.constant + 0x60) & 2) != 0) {
                      return 9;
                    }
                    pcStack_c0 = (code *)0x1148f6;
                    VVar22.expression = VVar26.expression;
                    EVar12 = CodeHolder_reserveInternal
                                       (self,(CodeBuffer *)VVar26.expression,
                                        (size_t)(VVar6.label)->_offset);
                    dst = (RelocEntry **)VVar6;
                    allocator = VVar21;
                    if (EVar12 != 0) {
                      return EVar12;
                    }
                  }
                  lStack_98._0_1_ = *(uint8_t *)VVar26;
                  lStack_98._1_1_ = ((uint8_t *)((long)VVar26 + 1))[0];
                  lStack_98._2_1_ = ((uint8_t *)((long)VVar26 + 1))[1];
                  lStack_98._3_1_ = ((uint8_t *)((long)VVar26 + 3))[0];
                  lStack_98._4_1_ = ((uint8_t *)((long)VVar26 + 3))[1];
                  lStack_98._5_1_ = ((uint8_t *)((long)VVar26 + 3))[2];
                  lStack_98._6_1_ = ((uint8_t *)((long)VVar26 + 3))[3];
                  lStack_98._7_1_ = ((uint8_t *)((long)VVar26 + 3))[4];
                }
                uVar15 = (ulong)(self->_relocations).super_ZoneVectorBase._size;
                if (uVar15 == 0) goto LAB_00114bc0;
                VVar26 = (Value)(self->_relocations).super_ZoneVectorBase._data;
                pVStack_78 = (Value *)((VVar26.expression)->valueType + uVar15 * 8 + -1);
                uStack_90 = (ulong)(bVar2 & 1) ^ 3;
                uVar16 = 0;
                pCStack_88 = self;
                goto LAB_00114950;
              }
              self = (CodeHolder *)((long)(pCVar25->_allocator)._slots + (uVar16 - 0x48));
              VVar21._0_1_ = (byte)VVar21.constant | CARRY8((ulong)pCVar25,uVar16);
              VVar21.constant._1_7_ = 0;
            }
            lVar19 = lVar19 + 8;
          } while ((ulong)*(uint32_t *)((long)(pZVar23 + 2) + 8) << 3 != lVar19);
          uVar13 = -(uint)((char)VVar21.constant != '\0') | (uint)self;
        }
        return uVar13;
      }
    }
    EVar12 = 1;
  }
  return EVar12;
LAB_00114950:
  allocator.constant = *VVar26.constant;
  iVar3 = *(int *)((allocator.expression)->reserved + 1);
  if (iVar3 == 0) goto LAB_00114b34;
  uVar13 = (self->_sections).super_ZoneVectorBase._size;
  if (uVar13 <= *(uint *)((allocator.expression)->value + 1)) {
    pcStack_c0 = (code *)0x114c13;
    relocateToBase();
    return 0x18;
  }
  pvVar7 = (self->_sections).super_ZoneVectorBase._data;
  lVar19 = *(long *)((long)pvVar7 + (ulong)*(uint *)((allocator.expression)->value + 1) * 8);
  uVar4 = (allocator.label)->_parentId;
  if ((ulong)uVar4 == 0xffffffff) {
    lVar24 = 0;
  }
  else {
    if (uVar13 <= uVar4) {
      pcStack_c0 = (code *)0x114c22;
      relocateToBase();
      return 2;
    }
    lVar24 = *(long *)((long)pvVar7 + (ulong)uVar4 * 8);
  }
  pCVar25 = (CodeHolder *)(allocator.label)->_section;
  uVar15 = (allocator.label)->_offset;
  if (*(ulong *)(lVar19 + 0x50) <= uVar15) {
    return 0x18;
  }
  EStack_a4 = 0x18;
  out = (uint64_t *)(ulong)*(byte *)((long)(allocator.expression)->value + 2);
  if ((uint64_t *)(*(ulong *)(lVar19 + 0x50) - uVar15) < out) {
    return 0x18;
  }
  if (4 < iVar3 - 1U) {
    return 0x18;
  }
  VVar22 = (Value)((Value *)(lVar19 + 0x10))->expression;
  sStack_a0 = *(size_t *)(lVar19 + 0x48);
  dst = (RelocEntry **)(uVar15 + *(byte *)((long)(allocator.expression)->value + 4));
  pCStack_b0 = pCVar25;
  switch(iVar3) {
  case 1:
    VVar22.expression = (Expression *)&pCStack_b0;
    uVar27 = uVar27 & 0xffffffff;
    pcStack_c0 = (code *)0x114a15;
    uStack_80 = uVar16;
    EVar12 = CodeHolder_evaluateExpression(pCVar25,VVar22.expression,out);
    uVar16 = uStack_80;
    self = pCStack_88;
    if (EVar12 != 0) {
      return EVar12;
    }
    break;
  case 2:
    goto switchD_001149fb_caseD_2;
  case 3:
    if (lVar24 == 0) {
      return 0x18;
    }
    pCVar25 = (CodeHolder *)
              ((long)(pCVar25->_allocator)._slots +
              (long)(VVar21.expression[-3].valueType + *(long *)(lVar24 + 0x10) + -1));
    pCStack_b0 = pCVar25;
    goto switchD_001149fb_caseD_2;
  case 4:
    VVar22.expression = (Expression *)((VVar22.expression)->valueType + (long)(VVar21.constant - 1))
    ;
    pCStack_b0 = (CodeHolder *)
                 ((long)pCVar25 -
                 (long)((long)out + (long)((VVar22.expression)->valueType + (uVar15 - 1))));
    pCVar25 = pCStack_b0;
    if ((uVar27 & 1) != 0) goto switchD_001149fb_caseD_2;
    pCVar25 = (CodeHolder *)((ulong)&pCStack_b0[0x6bca1a]._addressTableSection >> 0x20);
    if (pCVar25 != (CodeHolder *)0x0) {
      return 0x19;
    }
    break;
  case 5:
    if (dst < (Section *)0x2) {
      return 0x18;
    }
    if (*(char *)((long)(allocator.expression)->value + 3) != '\x04') {
      return 0x18;
    }
    pCStack_b0 = (CodeHolder *)
                 ((long)pCVar25 -
                 (long)((long)out +
                       (long)((VVar21.expression)->valueType +
                             (long)((VVar22.expression)->valueType + (uVar15 - 2)))));
    if ((CodeHolder *)(long)(int)pCStack_b0 == pCStack_b0) goto switchD_001149fb_caseD_2;
    pAVar17 = (self->_addressTableEntries)._root;
    while( true ) {
      if (pAVar17 == (AddressTableEntry *)0x0) {
        return 0x18;
      }
      pCVar8 = (CodeHolder *)pAVar17->_address;
      uVar13 = (uint)(pCVar8 >= pCVar25 && pCVar8 != pCVar25) - (uint)(pCVar8 < pCVar25);
      if (uVar13 == 0) break;
      pAVar17 = (AddressTableEntry *)
                ((pAVar17->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[uVar13 >> 0x1f] & 0xfffffffffffffffe);
    }
    if ((Section *)VVar6.constant == (Section *)0x0) goto LAB_00114c2e;
    uVar13 = pAVar17->_slot;
    if (uVar13 == 0xffffffff) {
      uVar13 = (uint)uVar16;
      pAVar17->_slot = uVar13;
      uVar16 = (ulong)(uVar13 + 1);
    }
    pCVar25 = (CodeHolder *)((ulong)uVar13 << ((byte)uStack_90 & 0x3f));
    pCStack_b0 = (CodeHolder *)
                 (((long)(VVar6.expression)->value[1].expression -
                  (long)((VVar22.expression)->valueType + (uVar15 - 1) + (long)out)) + (long)pCVar25
                 );
    if ((CodeHolder *)(long)(int)pCStack_b0 != pCStack_b0) {
      return 0x19;
    }
    uVar11 = '\x15';
    if (((Expression *)dst)->valueType[sStack_a0 - 2] != 0xe8) {
      if (((Expression *)dst)->valueType[sStack_a0 - 2] != 0xe9) {
        return 0x18;
      }
      uVar11 = '%';
    }
    ((Expression *)dst)->valueType[sStack_a0 - 3] = 0xff;
    ((Expression *)dst)->valueType[sStack_a0 - 2] = uVar11;
    *(Section **)((long)(pCVar25->_allocator)._slots + lStack_98 + -0x48) =
         (allocator.label)->_section;
  }
LAB_00114aee:
  switch(*(undefined1 *)((long)(allocator.expression)->value + 3)) {
  case 1:
    ((Expression *)dst)->valueType[sStack_a0 - 1] = (uint8_t)pCStack_b0;
    break;
  case 2:
    *(undefined2 *)(((Expression *)dst)->valueType + (sStack_a0 - 1)) = pCStack_b0._0_2_;
    break;
  default:
    return EStack_a4;
  case 4:
    *(undefined4 *)(((Expression *)dst)->valueType + (sStack_a0 - 1)) = pCStack_b0._0_4_;
    break;
  case 8:
    *(CodeHolder **)(((Expression *)dst)->valueType + (sStack_a0 - 1)) = pCStack_b0;
  }
LAB_00114b34:
  VVar26.expression = (Expression *)(VVar26.expression)->value;
  if ((Value *)VVar26.constant == pVStack_78) goto LAB_00114bc0;
  goto LAB_00114950;
switchD_001149fb_caseD_2:
  goto LAB_00114aee;
LAB_00114bc0:
  sVar5 = (self->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar5 != 0) {
    if (*(Section **)
         ((long)(self->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar5 - 1) * 8) ==
        (Section *)VVar6.constant) {
      pRVar14 = (RelocEntry *)(ulong)(uint)((int)uVar16 << ((byte)uVar27 & 1 ^ 3));
      *(RelocEntry **)(VVar6.constant + 0x50) = pRVar14;
      (VVar6.label)->_offset = (uint64_t)pRVar14;
    }
    return 0;
  }
  pcStack_c0 = (code *)0x114c2e;
  relocateToBase();
LAB_00114c2e:
  pcStack_c0 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar19 = 0;
  puVar28 = auStack_110;
  bVar10 = true;
  VStack_100 = VVar22;
  VStack_e8 = (Value)dst;
  VStack_e0 = VVar26;
  uStack_d8 = uVar27;
  pCStack_d0 = self;
  VStack_c8 = allocator;
  pcStack_c0 = (code *)uVar16;
  do {
    bVar20 = bVar10;
    pSVar18 = (Slot *)(ulong)*(byte *)((long)(pCVar25->_allocator)._slots + lVar19 + -0x47);
    if ((Slot *)0x3 < pSVar18) {
      return 3;
    }
    switch(pSVar18) {
    case (Slot *)0x1:
      pSVar18 = (pCVar25->_allocator)._slots[lVar19 + -8];
      break;
    case (Slot *)0x2:
      pSVar18 = (pCVar25->_allocator)._slots[lVar19 + -8];
      pSVar9 = pSVar18[4].next;
      if (pSVar9 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar18 = (Slot *)((long)&(pSVar9[2].next)->next + (long)&(pSVar18[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar12 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar25->_allocator)._slots[lVar19 + -8],
                          (Expression *)&pSStack_f0,
                          (uint64_t *)
                          ((long)&switchD_00114c75::switchdataD_00136004 +
                          (long)(int)(&switchD_00114c75::switchdataD_00136004)[(long)pSVar18]));
      pSVar18 = pSStack_f0;
      if (EVar12 != 0) {
        return EVar12;
      }
    }
    *puVar28 = (ulong)pSVar18;
    lVar19 = 1;
    puVar28 = &uStack_f8;
    bVar10 = false;
  } while (bVar20);
  switch((pCVar25->_environment)._arch) {
  case '\0':
    uVar16 = uStack_f8 + auStack_110[0];
    break;
  case '\x01':
    uVar16 = auStack_110[0] - uStack_f8;
    break;
  case '\x02':
    uVar16 = uStack_f8 * auStack_110[0];
    break;
  case '\x03':
    auStack_110[0] = auStack_110[0] << ((byte)uStack_f8 & 0x3f);
    goto LAB_00114d20;
  case '\x04':
    auStack_110[0] = auStack_110[0] >> ((byte)uStack_f8 & 0x3f);
LAB_00114d20:
    uVar16 = 0;
    if (uStack_f8 < 0x40) {
      uVar16 = auStack_110[0];
    }
    break;
  case '\x05':
    uVar16 = 0x3f;
    if (uStack_f8 < 0x3f) {
      uVar16 = uStack_f8;
    }
    uVar16 = (long)auStack_110[0] >> ((byte)uVar16 & 0x3f);
    break;
  default:
    return 3;
  }
  (VStack_100.expression)->opType = (char)uVar16;
  (VStack_100.expression)->valueType[0] = (char)(uVar16 >> 8);
  (VStack_100.expression)->valueType[1] = (char)(uVar16 >> 0x10);
  (VStack_100.expression)->reserved[0] = (char)(uVar16 >> 0x18);
  (VStack_100.expression)->reserved[1] = (char)(uVar16 >> 0x20);
  (VStack_100.expression)->reserved[2] = (char)(uVar16 >> 0x28);
  (VStack_100.expression)->reserved[3] = (char)(uVar16 >> 0x30);
  (VStack_100.expression)->reserved[4] = (char)(uVar16 >> 0x38);
  return 0;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, uint32_t relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = uint8_t(relocType);
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}